

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Array<double,_1,1,0,_1,1>,Eigen::ArrayWrapper<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>,Eigen::internal::assign_op<double,double>>
               (Array<double,__1,_1,_0,__1,_1> *dst,
               ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
               *src,assign_op<double,_double> *func)

{
  Index func_00;
  Array<double,__1,_1,_0,__1,_1> *dstExpr;
  undefined1 local_88 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_48 [8];
  SrcEvaluatorType srcEvaluator;
  assign_op<double,_double> *func_local;
  ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  *src_local;
  Array<double,__1,_1,_0,__1,_1> *dst_local;
  
  srcEvaluator.
  super_unary_evaluator<Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_Eigen::internal::IndexBased,_double>
  .
  super_evaluator_wrapper_base<Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
  .m_argImpl.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)func;
  evaluator<Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>_>_>
  ::evaluator((evaluator<Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
               *)local_48,src);
  resize_if_allowed<Eigen::Array<double,_1,1,0,_1,1>,Eigen::ArrayWrapper<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>,double,double>
            (dst,src,(assign_op<double,_double> *)
                     srcEvaluator.
                     super_unary_evaluator<Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_Eigen::internal::IndexBased,_double>
                     .
                     super_evaluator_wrapper_base<Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                     .m_argImpl.
                     super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows);
  evaluator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::evaluator
            ((evaluator<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator.
            super_unary_evaluator<Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_Eigen::internal::IndexBased,_double>
            .
            super_evaluator_wrapper_base<Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
            .m_argImpl.
            super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
  dstExpr = EigenBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::const_cast_derived
                      ((EigenBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::evaluator<Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Array<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
              *)local_88,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_48,
             (assign_op<double,_double> *)func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::evaluator<Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Array<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)local_88);
  evaluator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::~evaluator
            ((evaluator<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)&kernel.m_dstExpr);
  evaluator<Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>_>_>
  ::~evaluator((evaluator<Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                *)local_48);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}